

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O0

CURLcode namevalue(char *header,size_t hlen,uint type,char **name,char **value)

{
  bool bVar1;
  char *local_40;
  char *end;
  char **value_local;
  char **name_local;
  uint type_local;
  size_t hlen_local;
  char *header_local;
  
  local_40 = header + hlen;
  *name = header;
  hlen_local = (size_t)header;
  if (type == 0x10) {
    if (*header != ':') {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    hlen_local = (size_t)(header + 1);
  }
  while( true ) {
    bVar1 = false;
    if (*(char *)hlen_local != '\0') {
      bVar1 = *(char *)hlen_local != ':';
    }
    if (!bVar1) break;
    hlen_local = hlen_local + 1;
  }
  if (*(char *)hlen_local == '\0') {
    header_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  else {
    *(undefined1 *)hlen_local = 0;
    do {
      hlen_local = hlen_local + 1;
      bVar1 = false;
      if ((*(char *)hlen_local != '\0') && (bVar1 = true, *(char *)hlen_local != ' ')) {
        bVar1 = *(char *)hlen_local == '\t';
      }
    } while (bVar1);
    *value = (char *)hlen_local;
    while( true ) {
      local_40 = local_40 + -1;
      bVar1 = false;
      if ((((hlen_local < local_40) && (bVar1 = true, *local_40 != ' ')) &&
          (bVar1 = true, *local_40 != '\t')) && (bVar1 = false, '\t' < *local_40)) {
        bVar1 = *local_40 < '\x0e';
      }
      if (!bVar1) break;
      *local_40 = '\0';
    }
    header_local._4_4_ = CURLE_OK;
  }
  return header_local._4_4_;
}

Assistant:

static CURLcode namevalue(char *header, size_t hlen, unsigned int type,
                           char **name, char **value)
{
  char *end = header + hlen - 1; /* point to the last byte */
  DEBUGASSERT(hlen);
  *name = header;

  if(type == CURLH_PSEUDO) {
    if(*header != ':')
      return CURLE_BAD_FUNCTION_ARGUMENT;
    header++;
  }

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon, null it */
    *header++ = 0;
  else
    return CURLE_BAD_FUNCTION_ARGUMENT;

  /* skip all leading space letters */
  while(*header && ISBLANK(*header))
    header++;

  *value = header;

  /* skip all trailing space letters */
  while((end > header) && ISSPACE(*end))
    *end-- = 0; /* nul terminate */
  return CURLE_OK;
}